

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O1

uint32 * rw::ps2::instanceXYZ(uint32 *p,Geometry *g,Mesh *m,uint32 idx,uint32 n)

{
  ushort uVar1;
  V3d *pVVar2;
  uint16 *puVar3;
  ulong uVar4;
  
  if (idx < n + idx) {
    pVVar2 = g->morphTargets->vertices;
    puVar3 = m->indices;
    uVar4 = (ulong)idx;
    do {
      uVar1 = puVar3[uVar4];
      *p = (uint32)pVVar2[uVar1].x;
      ((float32 *)p)[1] = pVVar2[uVar1].y;
      ((float32 *)p)[2] = pVVar2[uVar1].z;
      p = (uint32 *)((float32 *)p + 3);
      uVar4 = uVar4 + 1;
    } while (n + idx != uVar4);
  }
  if (((ulong)p & 0xf) != 0) {
    uVar4 = (ulong)(0xcU - (int)p & 0xc);
    memset(p,0,uVar4 + 4);
    p = (uint32 *)((long)p + uVar4 + 4);
  }
  return (uint32 *)(float32 *)p;
}

Assistant:

uint32*
instanceXYZ(uint32 *p, Geometry *g, Mesh *m, uint32 idx, uint32 n)
{
	uint16 j;
	uint32 *d = (uint32*)g->morphTargets[0].vertices;
	for(uint32 i = idx; i < idx+n; i++){
		j = m->indices[i];
		*p++ = d[j*3+0];
		*p++ = d[j*3+1];
		*p++ = d[j*3+2];
	}
	while((uintptr)p % 0x10)
		*p++ = 0;
	return p;
}